

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

bool __thiscall
JsUtil::
BaseDictionary<std::type_info_const*,bool(*)(std::type_info_const*,bool,void*),Memory::NoCheckHeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::TryGetValue<std::type_info_const*>
          (BaseDictionary<std::type_info_const*,bool(*)(std::type_info_const*,bool,void*),Memory::NoCheckHeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
           *this,type_info **key,_func_bool_type_info_ptr_bool_void_ptr **value)

{
  long lVar1;
  uint uVar2;
  DictionaryStats *this_00;
  uint uVar3;
  
  lVar1 = *(long *)this;
  uVar2 = 0;
  if (lVar1 != 0) {
    uVar2 = BaseDictionary<const_std::type_info_*,_bool_(*)(const_std::type_info_*,_bool,_void_*),_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::GetBucket((uint)((ulong)*key >> 3) | 1,*(int *)(this + 0x1c),*(int *)(this + 0x2c));
    uVar3 = *(uint *)(lVar1 + (ulong)uVar2 * 4);
    uVar2 = 0;
    if (-1 < (int)uVar3) {
      uVar2 = 0;
      do {
        if (*(type_info **)(*(long *)(this + 8) + 0x10 + (ulong)uVar3 * 0x18) == *key) {
          this_00 = *(DictionaryStats **)(this + 0x30);
          goto LAB_00735500;
        }
        uVar2 = uVar2 + 1;
        uVar3 = *(uint *)(*(long *)(this + 8) + (ulong)uVar3 * 0x18 + 8);
      } while (-1 < (int)uVar3);
    }
  }
  this_00 = *(DictionaryStats **)(this + 0x30);
  uVar3 = 0xffffffff;
LAB_00735500:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,uVar2);
  }
  if (-1 < (int)uVar3) {
    *value = *(_func_bool_type_info_ptr_bool_void_ptr **)(*(long *)(this + 8) + (ulong)uVar3 * 0x18)
    ;
  }
  return -1 < (int)uVar3;
}

Assistant:

bool TryGetValue(const TLookup& key, TValue* value) const
        {
            int i = FindEntryWithKey(key);
            if (i >= 0)
            {
                *value = entries[i].Value();
                return true;
            }
            return false;
        }